

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O1

void zcheck_tempv(int n,doublecomplex *tempv)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  char msg [256];
  char acStack_138 [264];
  
  if (0 < n) {
    pdVar2 = &tempv->i;
    uVar3 = 0;
    do {
      dVar1 = ((doublecomplex *)(pdVar2 + -1))->r;
      if ((((dVar1 != 0.0) || (NAN(dVar1))) || (*pdVar2 != 0.0)) || (NAN(*pdVar2))) {
        fprintf(_stderr,"tempv[%d] = {%f, %f}\n",dVar1,*pdVar2,uVar3 & 0xffffffff);
        sprintf(acStack_138,"%s at line %d in file %s\n","zcheck_tempv",0x15c,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zutil.c");
        superlu_abort_and_exit(acStack_138);
      }
      uVar3 = uVar3 + 1;
      pdVar2 = pdVar2 + 2;
    } while ((uint)n != uVar3);
  }
  return;
}

Assistant:

void zcheck_tempv(int n, doublecomplex *tempv)
{
    int i;
	
    for (i = 0; i < n; i++) {
	if ((tempv[i].r != 0.0) || (tempv[i].i != 0.0))
	{
	    fprintf(stderr,"tempv[%d] = {%f, %f}\n", i, tempv[i].r, tempv[i].i);
	    ABORT("zcheck_tempv");
	}
    }
}